

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

ParameterizedTestSuiteInfo<(anonymous_namespace)::ObmcVarianceHBDTest> * __thiscall
testing::internal::ParameterizedTestSuiteRegistry::
GetTestSuitePatternHolder<(anonymous_namespace)::ObmcVarianceHBDTest>
          (ParameterizedTestSuiteRegistry *this,char *test_suite_name,CodeLocation *code_location)

{
  pointer ppPVar1;
  ParameterizedTestSuiteInfoBase *pPVar2;
  iterator __position;
  long *plVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::ObmcVarianceHBDTest> *pPVar7;
  char *pcVar8;
  pointer ppPVar9;
  pointer ppPVar10;
  size_type __dnew;
  ParameterizedTestSuiteInfoBase local_a0;
  long *local_98;
  vector<testing::internal::ParameterizedTestSuiteInfoBase*,std::allocator<testing::internal::ParameterizedTestSuiteInfoBase*>>
  *local_90;
  pointer local_88;
  undefined1 *local_80;
  long local_78;
  undefined1 local_70 [16];
  int local_60;
  CodeLocation local_58;
  
  ppPVar1 = (this->test_suite_infos_).
            super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppPVar10 = (this->test_suite_infos_).
             super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_98 = (long *)test_suite_name;
  local_90 = (vector<testing::internal::ParameterizedTestSuiteInfoBase*,std::allocator<testing::internal::ParameterizedTestSuiteInfoBase*>>
              *)this;
  if (ppPVar1 == ppPVar10) {
    pPVar7 = (ParameterizedTestSuiteInfo<(anonymous_namespace)::ObmcVarianceHBDTest> *)0x0;
  }
  else {
    pPVar7 = (ParameterizedTestSuiteInfo<(anonymous_namespace)::ObmcVarianceHBDTest> *)0x0;
    local_88 = ppPVar10;
    do {
      ppPVar9 = ppPVar1 + 1;
      iVar5 = (*(*ppPVar1)->_vptr_ParameterizedTestSuiteInfoBase[2])();
      iVar5 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var,iVar5));
      if (iVar5 == 0) {
        iVar6 = (*(*ppPVar1)->_vptr_ParameterizedTestSuiteInfoBase[3])();
        if ((undefined1 *)CONCAT44(extraout_var_00,iVar6) !=
            &TypeIdHelper<(anonymous_namespace)::ObmcVarianceHBDTest>::dummy_) {
LAB_007989f0:
          plVar3 = local_98;
          local_58.file._M_dataplus._M_p = (pointer)&local_58.file.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_58,*local_98,local_98[1] + *local_98);
          local_58.line = (int)plVar3[4];
          ReportInvalidTestSuiteType("ObmcVarianceHBDTest",&local_58);
          CodeLocation::~CodeLocation(&local_58);
          posix::Abort();
        }
        pPVar2 = *ppPVar1;
        if (pPVar2 == (ParameterizedTestSuiteInfoBase *)0x0) {
          __cxa_bad_typeid();
          goto LAB_007989f0;
        }
        pcVar8 = *(char **)(pPVar2->_vptr_ParameterizedTestSuiteInfoBase[-1] + 8);
        if (pcVar8 == 
            "N7testing8internal26ParameterizedTestSuiteInfoIN12_GLOBAL__N_119ObmcVarianceHBDTestEEE"
           ) {
          bVar4 = true;
        }
        else if (*pcVar8 == '*') {
          bVar4 = false;
        }
        else {
          iVar6 = strcmp(pcVar8,
                         "N7testing8internal26ParameterizedTestSuiteInfoIN12_GLOBAL__N_119ObmcVarianceHBDTestEEE"
                        );
          bVar4 = iVar6 == 0;
        }
        bVar4 = IsTrue(bVar4);
        if (!bVar4) {
          GTestLog::GTestLog((GTestLog *)&local_a0,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-port.h"
                             ,0x45e);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Condition typeid(*base) == typeid(Derived) failed. ",
                     0x33);
          GTestLog::~GTestLog((GTestLog *)&local_a0);
          ppPVar10 = local_88;
        }
        pPVar7 = (ParameterizedTestSuiteInfo<(anonymous_namespace)::ObmcVarianceHBDTest> *)
                 __dynamic_cast(pPVar2,&ParameterizedTestSuiteInfoBase::typeinfo,
                                &ParameterizedTestSuiteInfo<(anonymous_namespace)::ObmcVarianceHBDTest>
                                 ::typeinfo,0);
      }
    } while ((iVar5 != 0) && (ppPVar1 = ppPVar9, ppPVar9 != ppPVar10));
  }
  if (pPVar7 == (ParameterizedTestSuiteInfo<(anonymous_namespace)::ObmcVarianceHBDTest> *)0x0) {
    pPVar7 = (ParameterizedTestSuiteInfo<(anonymous_namespace)::ObmcVarianceHBDTest> *)
             operator_new(0x80);
    plVar3 = local_98;
    local_80 = local_70;
    std::__cxx11::string::_M_construct<char*>((string *)&local_80,*local_98,local_98[1] + *local_98)
    ;
    local_60 = (int)plVar3[4];
    (pPVar7->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase =
         (_func_int **)&PTR__ParameterizedTestSuiteInfo_010af130;
    (pPVar7->test_suite_name_)._M_dataplus._M_p = (pointer)&(pPVar7->test_suite_name_).field_2;
    local_a0._vptr_ParameterizedTestSuiteInfoBase = (_func_int **)0x13;
    pcVar8 = (char *)std::__cxx11::string::_M_create
                               ((ulong *)&pPVar7->test_suite_name_,(ulong)&local_a0);
    (pPVar7->test_suite_name_)._M_dataplus._M_p = pcVar8;
    (pPVar7->test_suite_name_).field_2._M_allocated_capacity =
         (size_type)local_a0._vptr_ParameterizedTestSuiteInfoBase;
    builtin_strncpy(pcVar8,"ObmcVarianceHBDTest",0x13);
    (pPVar7->test_suite_name_)._M_string_length =
         (size_type)local_a0._vptr_ParameterizedTestSuiteInfoBase;
    (pPVar7->test_suite_name_)._M_dataplus._M_p[(long)local_a0._vptr_ParameterizedTestSuiteInfoBase]
         = '\0';
    (pPVar7->code_location_).file._M_dataplus._M_p = (pointer)&(pPVar7->code_location_).file.field_2
    ;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pPVar7->code_location_,local_80,local_80 + local_78);
    (pPVar7->code_location_).line = local_60;
    (pPVar7->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::ObmcVarianceHBDTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::ObmcVarianceHBDTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pPVar7->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::ObmcVarianceHBDTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::ObmcVarianceHBDTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pPVar7->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::ObmcVarianceHBDTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::ObmcVarianceHBDTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pPVar7->instantiations_).
    super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::ObmcVarianceHBDTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::ObmcVarianceHBDTest>::InstantiationInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pPVar7->instantiations_).
    super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::ObmcVarianceHBDTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::ObmcVarianceHBDTest>::InstantiationInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pPVar7->instantiations_).
    super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::ObmcVarianceHBDTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::ObmcVarianceHBDTest>::InstantiationInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_80 != local_70) {
      operator_delete(local_80);
    }
    __position._M_current = *(ParameterizedTestSuiteInfoBase ***)(local_90 + 8);
    if (__position._M_current == *(ParameterizedTestSuiteInfoBase ***)(local_90 + 0x10)) {
      local_a0._vptr_ParameterizedTestSuiteInfoBase = (_func_int **)pPVar7;
      std::
      vector<testing::internal::ParameterizedTestSuiteInfoBase*,std::allocator<testing::internal::ParameterizedTestSuiteInfoBase*>>
      ::_M_realloc_insert<testing::internal::ParameterizedTestSuiteInfoBase*>
                (local_90,__position,(ParameterizedTestSuiteInfoBase **)&local_a0);
    }
    else {
      *__position._M_current = (ParameterizedTestSuiteInfoBase *)pPVar7;
      *(long *)(local_90 + 8) = *(long *)(local_90 + 8) + 8;
    }
  }
  return pPVar7;
}

Assistant:

ParameterizedTestSuiteInfo<TestSuite>* GetTestSuitePatternHolder(
      const char* test_suite_name, CodeLocation code_location) {
    ParameterizedTestSuiteInfo<TestSuite>* typed_test_info = nullptr;
    for (auto& test_suite_info : test_suite_infos_) {
      if (test_suite_info->GetTestSuiteName() == test_suite_name) {
        if (test_suite_info->GetTestSuiteTypeId() != GetTypeId<TestSuite>()) {
          // Complain about incorrect usage of Google Test facilities
          // and terminate the program since we cannot guaranty correct
          // test suite setup and tear-down in this case.
          ReportInvalidTestSuiteType(test_suite_name, code_location);
          posix::Abort();
        } else {
          // At this point we are sure that the object we found is of the same
          // type we are looking for, so we downcast it to that type
          // without further checks.
          typed_test_info = CheckedDowncastToActualType<
              ParameterizedTestSuiteInfo<TestSuite>>(test_suite_info);
        }
        break;
      }
    }
    if (typed_test_info == nullptr) {
      typed_test_info = new ParameterizedTestSuiteInfo<TestSuite>(
          test_suite_name, code_location);
      test_suite_infos_.push_back(typed_test_info);
    }
    return typed_test_info;
  }